

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2LdStPre(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  DecodeStatus DVar6;
  uint addr;
  uint Rn;
  uint Rt;
  uint load;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Rt = 3;
  _load = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Insn,0xc,4);
  RegNo_00 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0,8);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,9,1);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,0x14,1);
  if (RegNo_00 == 0xf) {
    uVar5 = MCInst_getOpcode(pMStack_18);
    switch(uVar5) {
    case 0x943:
    case 0x944:
      MCInst_setOpcode(pMStack_18,0x947);
      break;
    default:
      return MCDisassembler_Fail;
    case 0x952:
    case 0x953:
      MCInst_setOpcode(pMStack_18,0x956);
      break;
    case 0x95a:
    case 0x95b:
      if (RegNo == 0xf) {
        MCInst_setOpcode(pMStack_18,0x9b3);
      }
      else {
        MCInst_setOpcode(pMStack_18,0x95e);
      }
      break;
    case 0x962:
    case 0x963:
      MCInst_setOpcode(pMStack_18,0x966);
      break;
    case 0x96a:
    case 0x96b:
      MCInst_setOpcode(pMStack_18,0x96e);
    }
    Inst_local._4_4_ =
         DecodeT2LoadLabel(pMStack_18,Address_local._4_4_,(uint64_t)Decoder_local,_load);
  }
  else {
    if (uVar4 == 0) {
      DVar6 = DecodeGPRRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_load);
      _Var1 = Check(&Rt,DVar6);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    DVar6 = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_load);
    _Var1 = Check(&Rt,DVar6);
    if (_Var1) {
      if (uVar4 != 0) {
        DVar6 = DecodeGPRRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_load);
        _Var1 = Check(&Rt,DVar6);
        if (!_Var1) {
          return MCDisassembler_Fail;
        }
      }
      DVar6 = DecodeT2AddrModeImm8
                        (pMStack_18,RegNo_00 << 9 | uVar3 << 8 | uVar2,(uint64_t)Decoder_local,_load
                        );
      _Var1 = Check(&Rt,DVar6);
      if (_Var1) {
        Inst_local._4_4_ = Rt;
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeT2LdStPre(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned load;
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned addr = fieldFromInstruction_4(Insn, 0, 8);
	addr |= fieldFromInstruction_4(Insn, 9, 1) << 8;
	addr |= Rn << 9;
	load = fieldFromInstruction_4(Insn, 20, 1);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDR_PRE:
			case ARM_t2LDR_POST:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRB_PRE:
			case ARM_t2LDRB_POST:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRH_PRE:
			case ARM_t2LDRH_POST:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSB_PRE:
			case ARM_t2LDRSB_POST:
				if (Rt == 15)
					MCInst_setOpcode(Inst, ARM_t2PLIpci);
				else
					MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRSH_PRE:
			case ARM_t2LDRSH_POST:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (!load) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;

	if (load) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeT2AddrModeImm8(Inst, addr, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}